

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Own<const_kj::ReadableFile,_std::nullptr_t> __thiscall
kj::ReadableDirectory::openFile(ReadableDirectory *this,PathPtr path)

{
  Fault FVar1;
  Clock *clock;
  ReadableFile *extraout_RDX;
  Own<const_kj::ReadableFile,_std::nullptr_t> OVar2;
  Fault f;
  ReadableFile *pRStack_50;
  OwnOwn<const_kj::ReadableFile,_std::nullptr_t> _file552;
  PathPtr path_local;
  
  path_local.parts.ptr = (String *)path.parts.size_;
  (**(code **)(((path.parts.ptr)->content).ptr + 0x50))(&f);
  FVar1 = f;
  _file552.value.disposer = (Disposer *)f.exception;
  _file552.value.ptr = pRStack_50;
  Own<const_kj::ReadableFile,_std::nullptr_t>::dispose
            ((Own<const_kj::ReadableFile,_std::nullptr_t> *)&f);
  if (pRStack_50 == (ReadableFile *)0x0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[13],kj::PathPtr&>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x22b,FAILED,(char *)0x0,"\"no such file\", path",(char (*) [13])"no such file",
               &path_local);
    kj::_::Debug::Fault::~Fault(&f);
    clock = nullClock();
    newInMemoryFile((kj *)&f,clock);
    (this->super_FsNode)._vptr_FsNode = (_func_int **)f.exception;
    this[1].super_FsNode._vptr_FsNode = (_func_int **)0x0;
    Own<kj::File,_std::nullptr_t>::dispose((Own<kj::File,_std::nullptr_t> *)&f);
  }
  else {
    (this->super_FsNode)._vptr_FsNode = (_func_int **)FVar1.exception;
    this[1].super_FsNode._vptr_FsNode = (_func_int **)pRStack_50;
    _file552.value.ptr = (ReadableFile *)0x0;
  }
  Own<const_kj::ReadableFile,_std::nullptr_t>::dispose(&_file552.value);
  OVar2.ptr = extraout_RDX;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

Own<const ReadableFile> ReadableDirectory::openFile(PathPtr path) const {
  KJ_IF_SOME(file, tryOpenFile(path)) {
    return kj::mv(file);
  } else {
    KJ_FAIL_REQUIRE("no such file", path) { break; }